

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O3

adt_bytes_t * dtl_sv_get_bytes(dtl_sv_t *self)

{
  if ((self != (dtl_sv_t *)0x0) && ((self->u32Flags & 0xf0) == 0xc0)) {
    return (adt_bytes_t *)(self->pAny->val).i64;
  }
  return (adt_bytes_t *)0x0;
}

Assistant:

const adt_bytes_t* dtl_sv_get_bytes(const dtl_sv_t* self)
{
   const adt_bytes_t *retval = (const adt_bytes_t*) 0;
   if (self != 0)
   {
      dtl_sv_type_id currentType = dtl_sv_type(self);
      if (currentType == DTL_SV_BYTES)
      {
         retval = self->pAny->val.bytes;
      }
   }
   return retval;
}